

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkSurfaceTransformFlagBitsKHR
Diligent::SurfaceTransformToVkSurfaceTransformFlag(SURFACE_TRANSFORM SrfTransform)

{
  string msg;
  
  switch(SrfTransform) {
  case SURFACE_TRANSFORM_OPTIMAL:
    FormatString<char[58]>
              (&msg,(char (*) [58])"Optimal transform does not have corresponding Vulkan flag");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SurfaceTransformToVkSurfaceTransformFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x601);
    goto LAB_0024a59e;
  case SURFACE_TRANSFORM_IDENTITY:
  case SURFACE_TRANSFORM_ROTATE_90:
    break;
  case SURFACE_TRANSFORM_ROTATE_180:
    SrfTransform = SURFACE_TRANSFORM_ROTATE_270;
    break;
  case SURFACE_TRANSFORM_ROTATE_270:
    SrfTransform = SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR:
    SrfTransform = 0x10;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90:
    SrfTransform = 0x20;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180:
    SrfTransform = 0x40;
    break;
  case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270:
    SrfTransform = 0x80;
    break;
  default:
    FormatString<char[29]>(&msg,(char (*) [29])"Unexpected surface transform");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"SurfaceTransformToVkSurfaceTransformFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x60e);
LAB_0024a59e:
    std::__cxx11::string::~string((string *)&msg);
    SrfTransform = SURFACE_TRANSFORM_IDENTITY;
  }
  return SrfTransform;
}

Assistant:

VkSurfaceTransformFlagBitsKHR SurfaceTransformToVkSurfaceTransformFlag(SURFACE_TRANSFORM SrfTransform)
{
    // clang-format off
    switch (SrfTransform)
    {
        case SURFACE_TRANSFORM_OPTIMAL:
            UNEXPECTED("Optimal transform does not have corresponding Vulkan flag");
            return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;

        case SURFACE_TRANSFORM_IDENTITY:                      return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_90:                     return VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_180:                    return VK_SURFACE_TRANSFORM_ROTATE_180_BIT_KHR;
        case SURFACE_TRANSFORM_ROTATE_270:                    return VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR:             return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90:   return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180:  return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_180_BIT_KHR;
        case SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270:  return VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;

        default:
            UNEXPECTED("Unexpected surface transform");
            return VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    }
    // clang-format on
}